

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhMapWriteRecord(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)

{
  sxu16 *psVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  unqlite_page *puVar5;
  unqlite_page *pPage;
  unqlite_page *pOld;
  
  pPage = (unqlite_page *)0x0;
  if (pEngine->iPageSize + -0x10 < (int)(uint)(pEngine->sPageMap).iPtr) {
    iVar3 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,(pEngine->sPageMap).iNum,&pOld);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = lhAcquirePage(pEngine,&pPage);
    puVar5 = pPage;
    if (iVar3 != 0) {
      return iVar3;
    }
    (pEngine->sPageMap).iNext = 0;
    (pEngine->sPageMap).iNum = pPage->iPage;
    (pEngine->sPageMap).nRec = 0;
    (pEngine->sPageMap).iPtr = 0xc;
    iVar3 = (*pEngine->pIo->xWrite)(pOld);
    if (iVar3 != 0) {
      return iVar3;
    }
    if (pOld->iPage == pEngine->pHeader->iPage) {
      SyBigEndianPack64(pOld->zData + 0x20,puVar5->iPage);
    }
    else {
      SyBigEndianPack64(pOld->zData,puVar5->iPage);
      (*pEngine->pIo->xPageUnref)(pOld);
    }
    iVar3 = (*pEngine->pIo->xWrite)(puVar5);
    if (iVar3 != 0) {
      return iVar3;
    }
    puVar2 = puVar5->zData;
    puVar2[0] = '\0';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar2[4] = '\0';
    puVar2[5] = '\0';
    puVar2[6] = '\0';
    puVar2[7] = '\0';
  }
  else {
    iVar3 = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,(pEngine->sPageMap).iNum,&pPage);
    puVar5 = pPage;
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  iVar3 = (*pEngine->pIo->xWrite)(puVar5);
  if (iVar3 == 0) {
    SyBigEndianPack64(pPage->zData + (pEngine->sPageMap).iPtr,iLogic);
    uVar4 = *(int *)&(pEngine->sPageMap).iPtr + 8;
    (pEngine->sPageMap).iPtr = (sxu16)uVar4;
    SyBigEndianPack64(pPage->zData + (uVar4 & 0xffff),iReal);
    psVar1 = &(pEngine->sPageMap).iPtr;
    *psVar1 = *psVar1 + 8;
    iVar3 = lhMapInstallBucket(pEngine,iLogic,iReal);
    if (iVar3 == 0) {
      uVar4 = (pEngine->sPageMap).nRec + 1;
      (pEngine->sPageMap).nRec = uVar4;
      if (pPage->iPage == pEngine->pHeader->iPage) {
        *(uint *)(pPage->zData + 0x28) =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000;
      }
      else {
        iVar3 = (*pEngine->pIo->xWrite)(pPage);
        if (iVar3 != 0) {
          return iVar3;
        }
        uVar4 = (pEngine->sPageMap).nRec;
        *(uint *)(pPage->zData + 8) =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      }
      iVar3 = 0;
    }
    else {
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

static int lhMapWriteRecord(lhash_kv_engine *pEngine,pgno iLogic,pgno iReal)
{
	lhash_bmap_page *pMap = &pEngine->sPageMap;
	unqlite_page *pPage = 0;
	int rc;
	if( pMap->iPtr > (pEngine->iPageSize - 16) /* 8 byte logical bucket number + 8 byte real bucket number */ ){
		unqlite_page *pOld;
		/* Point to the old page */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pMap->iNum,&pOld);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Acquire a new page */
		rc = lhAcquirePage(pEngine,&pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		/* Reflect the change  */
		pMap->iNext = 0;
		pMap->iNum = pPage->iPage;
		pMap->nRec = 0;
		pMap->iPtr = 8/* Next page number */+4/* Total records in the map*/;
		/* Link this page */
		rc = pEngine->pIo->xWrite(pOld);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		if( pOld->iPage == pEngine->pHeader->iPage ){
			/* First page (Hash header) */
			SyBigEndianPack64(&pOld->zData[4/*magic*/+4/*hash*/+8/* Free page */+8/*current split bucket*/+8/*Maximum split bucket*/],pPage->iPage);
		}else{
			/* Link the new page */
			SyBigEndianPack64(pOld->zData,pPage->iPage);
			/* Unref */
			pEngine->pIo->xPageUnref(pOld);
		}
		/* Assume the last bucket map page */
		rc = pEngine->pIo->xWrite(pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
		SyBigEndianPack64(pPage->zData,0); /* Next bucket map page on the list */
	}
	if( pPage == 0){
		/* Point to the current map page */
		rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,pMap->iNum,&pPage);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	/* Make page writable */
	rc = pEngine->pIo->xWrite(pPage);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Write the data */
	SyBigEndianPack64(&pPage->zData[pMap->iPtr],iLogic);
	pMap->iPtr += 8;
	SyBigEndianPack64(&pPage->zData[pMap->iPtr],iReal);
	pMap->iPtr += 8;
	/* Install the bucket map */
	rc = lhMapInstallBucket(pEngine,iLogic,iReal);
	if( rc == UNQLITE_OK ){
		/* Total number of records */
		pMap->nRec++;
		if( pPage->iPage == pEngine->pHeader->iPage ){
			/* Page one: Always writable */
			SyBigEndianPack32(
				&pPage->zData[4/*magic*/+4/*hash*/+8/* Free page */+8/*current split bucket*/+8/*Maximum split bucket*/+8/*Next map page*/],
				pMap->nRec);
		}else{
			/* Make page writable */
			rc = pEngine->pIo->xWrite(pPage);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			SyBigEndianPack32(&pPage->zData[8],pMap->nRec);
		}
	}
	return rc;
}